

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ImWchar c;
  uchar *puVar6;
  ImFont *this;
  ImFontAtlasCustomRect *pIVar7;
  ImFont **ppIVar8;
  ImFontGlyph *pIVar9;
  ImVec4 *pIVar10;
  ulong uVar11;
  ImVector<ImFont_*> *this_00;
  long lVar12;
  int i;
  ulong uVar13;
  uint uVar14;
  int i_1;
  int iVar15;
  uchar *__s;
  int iVar16;
  ulong __n;
  float fVar17;
  ImVec2 local_70;
  ImVec2 local_68;
  int local_60;
  uint local_5c;
  ImFontAtlas *local_58;
  ImFontAtlasCustomRect *local_50;
  ulong local_48;
  ulong local_40;
  ImVec4 *local_38;
  
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                  ,0x9a5,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar7 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar7->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                  ,0x957,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar7->Width != 0xd9) || (pIVar7->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                    ,0x95d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    ImFontAtlasBuildRender1bppRectFromString
              (atlas,(uint)uVar3,(uint)pIVar7->Y,0x6c,0x1b,
               "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
               ,'.',0xff);
    ImFontAtlasBuildRender1bppRectFromString
              (atlas,uVar3 + 0x6d,(uint)pIVar7->Y,0x6c,0x1b,
               "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
               ,'X',0xff);
  }
  else {
    if ((pIVar7->Width != 2) || (pIVar7->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                    ,0x966,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar16 = (uint)pIVar7->Y * atlas->TexWidth + (uint)uVar3;
    lVar12 = (long)(atlas->TexWidth + iVar16);
    atlas->TexPixelsAlpha8[lVar12 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar12] = 0xff;
    atlas->TexPixelsAlpha8[(long)iVar16 + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar16] = 0xff;
  }
  uVar14._0_2_ = pIVar7->X;
  uVar14._2_2_ = pIVar7->Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar14 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar14 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    local_50 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar3 = local_50->X;
    if (uVar3 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                    ,0x974,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    pIVar10 = atlas->TexUvLines;
    uVar11 = 0;
    uVar13 = 0;
    local_58 = atlas;
    for (__n = 0; __n != 0x40; __n = __n + 1) {
      local_40 = uVar11;
      local_38 = pIVar10;
      if (local_50->Height <= __n) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                      ,0x97e,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar4 = local_50->Width;
      uVar14 = (int)uVar13 + (uint)uVar4 >> 1;
      uVar11 = (ulong)uVar14;
      puVar6 = atlas->TexPixelsAlpha8;
      uVar5 = local_50->Y;
      iVar16 = (int)__n;
      local_60 = local_58->TexWidth;
      __s = puVar6 + ((iVar16 + (uint)uVar5) * local_60 + (uint)uVar3);
      local_5c = (uint)uVar3;
      local_48 = uVar13;
      memset(__s,0,uVar11);
      memset(__s + uVar11,0xff,__n);
      atlas = local_58;
      iVar15 = (int)local_40;
      memset(puVar6 + (ulong)(((uint)uVar5 + iVar15) * local_60 + local_5c) + __n + uVar11,0,
             (ulong)((uVar4 - uVar14) + (int)uVar13));
      uVar3 = local_50->X;
      uVar4 = local_50->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar17 = (atlas->TexUvScale).y;
      local_38->x = (float)((uVar14 + uVar3) - 1) * fVar1;
      fVar17 = ((float)(int)(iVar16 + 1 + (uint)uVar4) * fVar17 +
               (float)(int)(iVar16 + (uint)uVar4) * fVar17) * 0.5;
      local_38->y = fVar17;
      local_38->z = fVar1 * (float)(iVar16 + 1 + uVar14 + uVar3);
      local_38->w = fVar17;
      pIVar10 = local_38 + 1;
      uVar13 = (ulong)((int)local_48 - 1);
      uVar11 = (ulong)(iVar15 + 1);
    }
  }
  for (iVar16 = 0; iVar16 < (atlas->CustomRects).Size; iVar16 = iVar16 + 1) {
    pIVar7 = ImVector<ImFontAtlasCustomRect>::operator[](&atlas->CustomRects,iVar16);
    if ((pIVar7->Font != (ImFont *)0x0) && (pIVar7->GlyphID != 0)) {
      if (pIVar7->Font->ContainerAtlas != atlas) {
        __assert_fail("r->Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                      ,0x9b1,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      local_68.x = 0.0;
      local_68.y = 0.0;
      local_70.x = 0.0;
      local_70.y = 0.0;
      ImFontAtlas::CalcCustomRectUV(atlas,pIVar7,&local_68,&local_70);
      fVar1 = (pIVar7->GlyphOffset).x;
      fVar17 = (pIVar7->GlyphOffset).y;
      ImFont::AddGlyph(pIVar7->Font,(ImFontConfig *)0x0,(ImWchar)pIVar7->GlyphID,fVar1,fVar17,
                       (float)pIVar7->Width + fVar1,(float)pIVar7->Height + fVar17,local_68.x,
                       local_68.y,local_70.x,local_70.y,pIVar7->GlyphAdvanceX);
    }
  }
  this_00 = &atlas->Fonts;
  for (iVar16 = 0; iVar15 = this_00->Size, iVar16 < iVar15; iVar16 = iVar16 + 1) {
    ppIVar8 = ImVector<ImFont_*>::operator[](this_00,iVar16);
    if ((*ppIVar8)->DirtyLookupTables == true) {
      ppIVar8 = ImVector<ImFont_*>::operator[](this_00,iVar16);
      ImFont::BuildLookupTable(*ppIVar8);
    }
  }
  iVar16 = 0;
  do {
    if (iVar15 <= iVar16) {
      return;
    }
    ppIVar8 = ImVector<ImFont_*>::operator[](this_00,iVar16);
    this = *ppIVar8;
    if (this->EllipsisChar == 0xffff) {
      lVar12 = 0;
      do {
        if (lVar12 == 4) goto LAB_00148302;
        c = *(ImWchar *)((long)&DAT_00197744 + lVar12);
        pIVar9 = ImFont::FindGlyphNoFallback(this,c);
        lVar12 = lVar12 + 2;
      } while (pIVar9 == (ImFontGlyph *)0x0);
      this->EllipsisChar = c;
    }
LAB_00148302:
    iVar16 = iVar16 + 1;
    iVar15 = this_00->Size;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}